

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O0

bool __thiscall
iffl::
flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
::revalidate_data(flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
                  *this,size_type data_size)

{
  byte bVar1;
  iffl *this_00;
  unsigned_long *puVar2;
  buffer_type *pbVar3;
  default_validate_element_fn<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
  *in_R8;
  buffer_char_pointer local_80;
  type *local_58;
  type *buffer_view;
  type_conflict *valid;
  pair<bool,_iffl::flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>_>
  local_40;
  size_type local_20;
  size_type new_data_size;
  size_type data_size_local;
  flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
  *this_local;
  
  new_data_size = data_size;
  data_size_local = (size_type)this;
  local_20 = total_capacity(this);
  if (new_data_size != 0xffffffffffffffff) {
    puVar2 = std::min<unsigned_long>(&new_data_size,&local_20);
    local_20 = *puVar2;
  }
  pbVar3 = buff(this);
  this_00 = (iffl *)pbVar3->begin;
  pbVar3 = buff(this);
  flat_forward_list_validate<pod_array_list_entry<char>,iffl::flat_forward_list_traits<pod_array_list_entry<char>>,iffl::default_validate_element_fn<pod_array_list_entry<char>,iffl::flat_forward_list_traits<pod_array_list_entry<char>>>>
            (&local_40,this_00,pbVar3->begin + local_20,(char *)((long)&valid + 7),in_R8);
  buffer_view = (type *)std::
                        get<0ul,bool,iffl::flat_forward_list_ref<pod_array_list_entry<char>,iffl::flat_forward_list_traits<pod_array_list_entry<char>>>>
                                  (&local_40);
  local_58 = std::
             get<1ul,bool,iffl::flat_forward_list_ref<pod_array_list_entry<char>,iffl::flat_forward_list_traits<pod_array_list_entry<char>>>>
                       (&local_40);
  if (((ulong)(buffer_view->buffer_).begin & 1) == 0) {
    local_80 = (buffer_char_pointer)0x0;
  }
  else {
    flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
    ::last((flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
            *)&stack0xffffffffffffffa0);
    local_80 = flat_forward_list_iterator_t<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
               ::get_ptr((flat_forward_list_iterator_t<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
                          *)&stack0xffffffffffffffa0);
  }
  pbVar3 = buff(this);
  pbVar3->last = local_80;
  bVar1 = *(byte *)&(buffer_view->buffer_).begin;
  std::
  pair<bool,_iffl::flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>_>
  ::~pair(&local_40);
  return (bool)(bVar1 & 1);
}

Assistant:

[[nodiscard]] bool revalidate_data(size_type data_size = npos) noexcept {
        size_type new_data_size{ total_capacity() };
        if (data_size != npos) {
            new_data_size = std::min(data_size, new_data_size);
        }
        auto[valid, buffer_view] = flat_forward_list_validate<T, TT>(buff().begin, 
                                                                     buff().begin + new_data_size);
        buff().last = valid ? buffer_view.last().get_ptr() : nullptr;

        return valid;
    }